

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

key_decoder * __thiscall unodb::key_decoder::decode(key_decoder *this,int32_t *v)

{
  int local_2c;
  uint local_20 [2];
  uint32_t u;
  uint32_t one;
  int32_t *v_local;
  key_decoder *this_local;
  
  local_20[1] = 1;
  _u = v;
  v_local = (int32_t *)this;
  decode(this,local_20);
  if (local_20[0] < 0x80000000) {
    local_2c = -1 - (0x7fffffff - local_20[0]);
  }
  else {
    local_2c = local_20[0] + 0x80000000;
  }
  *_u = local_2c;
  return this;
}

Assistant:

key_decoder &decode(std::int32_t &v) noexcept {
    constexpr auto one = static_cast<std::uint32_t>(1);
    std::uint32_t u;
    decode(u);
    v = (u >= msb32) ? static_cast<int32_t>(u - msb32)
                     : -static_cast<int32_t>(msb32 - one - u) - 1;
    return *this;
  }